

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int windowCodeOp(WindowCodeArg *p,int op,int regCountdown,int jumpOnEof)

{
  u8 uVar1;
  Parse *pParse;
  Window *pMWin;
  Vdbe *p_00;
  byte bVar2;
  int iVar3;
  int reg;
  int iVar4;
  int *piVar5;
  int iVar6;
  int iVar7;
  int p2;
  int p2_00;
  int local_44;
  
  pParse = p->pParse;
  pMWin = p->pMWin;
  p_00 = p->pVdbe;
  uVar1 = pMWin->eFrmType;
  p2 = pParse->nLabel + -1;
  pParse->nLabel = p2;
  if ((op == 2) && (pMWin->eStart == 'Z')) {
    return 0;
  }
  p2_00 = 0;
  if (0 < regCountdown) {
    if (uVar1 == 'Y') {
      p2_00 = p_00->nOp;
      if (op == 2) {
        if (pMWin->eStart == 'V') {
          iVar7 = (p->start).csr;
          iVar6 = (p->current).csr;
          iVar3 = 0x37;
        }
        else {
          iVar6 = (p->start).csr;
          iVar7 = (p->current).csr;
          iVar3 = 0x39;
        }
      }
      else {
        iVar7 = (p->current).csr;
        iVar6 = (p->end).csr;
        iVar3 = 0x36;
      }
      windowCodeRangeTest(p,iVar3,iVar6,regCountdown,iVar7,p2);
    }
    else {
      sqlite3VdbeAddOp3(p_00,0x3b,regCountdown,p2,1);
      p2_00 = 0;
    }
  }
  if ((op == 1) && (pMWin->regStartRowid == 0)) {
    windowAggFinal(p,0);
  }
  iVar7 = p_00->nOp;
  if (((regCountdown != 0) && (pMWin->eStart == pMWin->eEnd)) && (pMWin->eFrmType == 'Y')) {
    if (pParse->nTempReg == '\0') {
      iVar6 = pParse->nMem + 1;
      pParse->nMem = iVar6;
    }
    else {
      bVar2 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar2;
      iVar6 = pParse->aTempReg[bVar2];
    }
    if (pParse->nTempReg == '\0') {
      iVar3 = pParse->nMem + 1;
      pParse->nMem = iVar3;
    }
    else {
      bVar2 = pParse->nTempReg - 1;
      pParse->nTempReg = bVar2;
      iVar3 = pParse->aTempReg[bVar2];
    }
    if (op == 2) {
      sqlite3VdbeAddOp3(p_00,0x87,(p->start).csr,iVar6,0);
      sqlite3VdbeAddOp3(p_00,0x87,(p->end).csr,iVar3,0);
      iVar4 = iVar3;
LAB_001a9dc7:
      sqlite3VdbeAddOp3(p_00,0x39,iVar4,p2,iVar6);
    }
    else if (p->regRowid != 0) {
      sqlite3VdbeAddOp3(p_00,0x87,(p->end).csr,iVar6,0);
      iVar4 = p->regRowid;
      goto LAB_001a9dc7;
    }
    if (iVar6 != 0) {
      bVar2 = pParse->nTempReg;
      if ((ulong)bVar2 < 8) {
        pParse->nTempReg = bVar2 + 1;
        pParse->aTempReg[bVar2] = iVar6;
      }
    }
    if (iVar3 != 0) {
      bVar2 = pParse->nTempReg;
      if ((ulong)bVar2 < 8) {
        pParse->nTempReg = bVar2 + 1;
        pParse->aTempReg[bVar2] = iVar3;
      }
    }
  }
  if (op == 2) {
    iVar6 = (p->start).csr;
    local_44 = (p->start).reg;
    iVar3 = pMWin->regStartRowid;
    if (iVar3 != 0) goto LAB_001a9e8f;
    iVar3 = p->regArg;
    iVar4 = 1;
LAB_001a9eb1:
    windowAggStep(p,pMWin,iVar6,iVar4,iVar3);
  }
  else if (op == 1) {
    iVar6 = (p->current).csr;
    local_44 = (p->current).reg;
    windowReturnOneRow(p);
  }
  else {
    iVar6 = (p->end).csr;
    local_44 = (p->end).reg;
    if (pMWin->regStartRowid == 0) {
      iVar3 = p->regArg;
      iVar4 = 0;
      goto LAB_001a9eb1;
    }
    iVar3 = pMWin->regEndRowid;
LAB_001a9e8f:
    sqlite3VdbeAddOp3(p_00,0x56,iVar3,1,0);
  }
  if (p->eDelete == op) {
    sqlite3VdbeAddOp3(p_00,0x82,iVar6,0,0);
    if (0 < (long)p_00->nOp) {
      p_00->aOp[(long)p_00->nOp + -1].p5 = 2;
    }
  }
  if (jumpOnEof == 0) {
    iVar3 = 0;
    sqlite3VdbeAddOp3(p_00,0x27,iVar6,(p_00->nOp - (uint)(uVar1 == 'L')) + 2,0);
    if (uVar1 != 'L') {
      iVar3 = 0;
      sqlite3VdbeAddOp3(p_00,9,0,p2,0);
    }
  }
  else {
    sqlite3VdbeAddOp3(p_00,0x27,iVar6,p_00->nOp + 2,0);
    iVar3 = sqlite3VdbeAddOp3(p_00,9,0,0,0);
  }
  if (uVar1 == 'L') goto LAB_001aa032;
  reg = 0;
  iVar4 = 0;
  if (pMWin->pOrderBy != (ExprList *)0x0) {
    iVar4 = pMWin->pOrderBy->nExpr;
  }
  if (iVar4 != 0) {
    reg = sqlite3GetTempRange(pParse,iVar4);
  }
  windowReadPeerValues(p,iVar6,reg);
  windowIfNewPeer(pParse,pMWin->pOrderBy,reg,local_44,iVar7);
  if (iVar4 == 1) {
    if (reg == 0) goto LAB_001aa032;
    bVar2 = pParse->nTempReg;
    if (7 < (ulong)bVar2) goto LAB_001aa032;
    pParse->nTempReg = bVar2 + 1;
    piVar5 = pParse->aTempReg + bVar2;
  }
  else {
    if (iVar4 <= pParse->nRangeReg) goto LAB_001aa032;
    pParse->nRangeReg = iVar4;
    piVar5 = &pParse->iRangeReg;
  }
  *piVar5 = reg;
LAB_001aa032:
  if (p2_00 != 0) {
    sqlite3VdbeAddOp3(p_00,9,0,p2_00,0);
  }
  sqlite3VdbeResolveLabel(p_00,p2);
  return iVar3;
}

Assistant:

static int windowCodeOp(
 WindowCodeArg *p,                /* Context object */
 int op,                          /* WINDOW_RETURN_ROW, AGGSTEP or AGGINVERSE */
 int regCountdown,                /* Register for OP_IfPos countdown */
 int jumpOnEof                    /* Jump here if stepped cursor reaches EOF */
){
  int csr, reg;
  Parse *pParse = p->pParse;
  Window *pMWin = p->pMWin;
  int ret = 0;
  Vdbe *v = p->pVdbe;
  int addrContinue = 0;
  int bPeer = (pMWin->eFrmType!=TK_ROWS);

  int lblDone = sqlite3VdbeMakeLabel(pParse);
  int addrNextRange = 0;

  /* Special case - WINDOW_AGGINVERSE is always a no-op if the frame
  ** starts with UNBOUNDED PRECEDING. */
  if( op==WINDOW_AGGINVERSE && pMWin->eStart==TK_UNBOUNDED ){
    assert( regCountdown==0 && jumpOnEof==0 );
    return 0;
  }

  if( regCountdown>0 ){
    if( pMWin->eFrmType==TK_RANGE ){
      addrNextRange = sqlite3VdbeCurrentAddr(v);
      assert( op==WINDOW_AGGINVERSE || op==WINDOW_AGGSTEP );
      if( op==WINDOW_AGGINVERSE ){
        if( pMWin->eStart==TK_FOLLOWING ){
          windowCodeRangeTest(
              p, OP_Le, p->current.csr, regCountdown, p->start.csr, lblDone
          );
        }else{
          windowCodeRangeTest(
              p, OP_Ge, p->start.csr, regCountdown, p->current.csr, lblDone
          );
        }
      }else{
        windowCodeRangeTest(
            p, OP_Gt, p->end.csr, regCountdown, p->current.csr, lblDone
        );
      }
    }else{
      sqlite3VdbeAddOp3(v, OP_IfPos, regCountdown, lblDone, 1);
      VdbeCoverage(v);
    }
  }

  if( op==WINDOW_RETURN_ROW && pMWin->regStartRowid==0 ){
    windowAggFinal(p, 0);
  }
  addrContinue = sqlite3VdbeCurrentAddr(v);

  /* If this is a (RANGE BETWEEN a FOLLOWING AND b FOLLOWING) or
  ** (RANGE BETWEEN b PRECEDING AND a PRECEDING) frame, ensure the
  ** start cursor does not advance past the end cursor within the
  ** temporary table. It otherwise might, if (a>b). Also ensure that,
  ** if the input cursor is still finding new rows, that the end
  ** cursor does not go past it to EOF. */
  if( pMWin->eStart==pMWin->eEnd && regCountdown
   && pMWin->eFrmType==TK_RANGE
  ){
    int regRowid1 = sqlite3GetTempReg(pParse);
    int regRowid2 = sqlite3GetTempReg(pParse);
    if( op==WINDOW_AGGINVERSE ){
      sqlite3VdbeAddOp2(v, OP_Rowid, p->start.csr, regRowid1);
      sqlite3VdbeAddOp2(v, OP_Rowid, p->end.csr, regRowid2);
      sqlite3VdbeAddOp3(v, OP_Ge, regRowid2, lblDone, regRowid1);
      VdbeCoverage(v);
    }else if( p->regRowid ){
      sqlite3VdbeAddOp2(v, OP_Rowid, p->end.csr, regRowid1);
      sqlite3VdbeAddOp3(v, OP_Ge, p->regRowid, lblDone, regRowid1);
      VdbeCoverageNeverNull(v);
    }
    sqlite3ReleaseTempReg(pParse, regRowid1);
    sqlite3ReleaseTempReg(pParse, regRowid2);
    assert( pMWin->eStart==TK_PRECEDING || pMWin->eStart==TK_FOLLOWING );
  }

  switch( op ){
    case WINDOW_RETURN_ROW:
      csr = p->current.csr;
      reg = p->current.reg;
      windowReturnOneRow(p);
      break;

    case WINDOW_AGGINVERSE:
      csr = p->start.csr;
      reg = p->start.reg;
      if( pMWin->regStartRowid ){
        assert( pMWin->regEndRowid );
        sqlite3VdbeAddOp2(v, OP_AddImm, pMWin->regStartRowid, 1);
      }else{
        windowAggStep(p, pMWin, csr, 1, p->regArg);
      }
      break;

    default:
      assert( op==WINDOW_AGGSTEP );
      csr = p->end.csr;
      reg = p->end.reg;
      if( pMWin->regStartRowid ){
        assert( pMWin->regEndRowid );
        sqlite3VdbeAddOp2(v, OP_AddImm, pMWin->regEndRowid, 1);
      }else{
        windowAggStep(p, pMWin, csr, 0, p->regArg);
      }
      break;
  }

  if( op==p->eDelete ){
    sqlite3VdbeAddOp1(v, OP_Delete, csr);
    sqlite3VdbeChangeP5(v, OPFLAG_SAVEPOSITION);
  }

  if( jumpOnEof ){
    sqlite3VdbeAddOp2(v, OP_Next, csr, sqlite3VdbeCurrentAddr(v)+2);
    VdbeCoverage(v);
    ret = sqlite3VdbeAddOp0(v, OP_Goto);
  }else{
    sqlite3VdbeAddOp2(v, OP_Next, csr, sqlite3VdbeCurrentAddr(v)+1+bPeer);
    VdbeCoverage(v);
    if( bPeer ){
      sqlite3VdbeAddOp2(v, OP_Goto, 0, lblDone);
    }
  }

  if( bPeer ){
    int nReg = (pMWin->pOrderBy ? pMWin->pOrderBy->nExpr : 0);
    int regTmp = (nReg ? sqlite3GetTempRange(pParse, nReg) : 0);
    windowReadPeerValues(p, csr, regTmp);
    windowIfNewPeer(pParse, pMWin->pOrderBy, regTmp, reg, addrContinue);
    sqlite3ReleaseTempRange(pParse, regTmp, nReg);
  }

  if( addrNextRange ){
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrNextRange);
  }
  sqlite3VdbeResolveLabel(v, lblDone);
  return ret;
}